

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall Lexer::Lexify(Lexer *this,char *code)

{
  uint uVar1;
  Lexeme *pLVar2;
  ulong uVar3;
  LexemeType LVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  int iVar9;
  byte *pbVar10;
  byte bVar11;
  LexemeType LVar12;
  ulong uVar13;
  byte *pbVar14;
  bool bVar15;
  
  if ((this->lexems).max < 0x801) {
    SmallArray<Lexeme,_32U>::grow(&this->lexems,0x800);
  }
  this->line = 0;
  pbVar14 = (byte *)code;
LAB_001cd251:
LAB_001cd257:
  bVar11 = *pbVar14;
  uVar13 = 1;
  uVar6 = (uint)pbVar14;
  if (bVar11 < 0x5b) {
    switch(bVar11) {
    case 9:
    case 0x20:
      do {
        pbVar14 = pbVar14 + 1;
        bVar11 = *pbVar14;
        if (((byte)(bVar11 - 0x21) < 0xe0) || (bVar11 == 10)) break;
      } while (bVar11 != 0xd);
      goto LAB_001cd257;
    case 10:
      code = (char *)(pbVar14 + 1);
      this->line = this->line + 1;
      pbVar14 = (byte *)code;
      goto LAB_001cd251;
    case 0xb:
    case 0xc:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x23:
    case 0x24:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      goto switchD_001cd279_caseD_b;
    case 0xd:
      code = (char *)(pbVar14 + 1);
      if (pbVar14[1] == 10) {
        code = (char *)(pbVar14 + 2);
      }
      this->line = this->line + 1;
      pbVar14 = (byte *)code;
      goto LAB_001cd251;
    case 0x21:
      bVar11 = pbVar14[1];
      LVar12 = lex_lognot;
      LVar4 = lex_nequal;
      goto LAB_001cd4db;
    case 0x22:
      uVar5 = this->line;
      pbVar10 = pbVar14 + 1;
      goto LAB_001cd4f1;
    case 0x25:
      bVar11 = pbVar14[1];
      LVar12 = lex_mod;
      LVar4 = lex_modset;
LAB_001cd4db:
      uVar5 = (uint)(bVar11 == 0x3d);
      if (bVar11 == 0x3d) {
        LVar12 = LVar4;
      }
LAB_001cd4df:
      uVar13 = (ulong)(uVar5 + 1);
      goto switchD_001cd2e4_caseD_7e;
    case 0x26:
      uVar13 = 2;
      if (pbVar14[1] == 0x26) {
        LVar12 = lex_logand;
        goto switchD_001cd2e4_caseD_7e;
      }
      if (pbVar14[1] == 0x3d) {
        LVar12 = lex_andset;
        goto switchD_001cd2e4_caseD_7e;
      }
      LVar12 = lex_bitand;
      goto LAB_001cd957;
    case 0x27:
      uVar5 = this->line;
      pbVar10 = pbVar14 + 1;
      goto LAB_001cd575;
    case 0x28:
      LVar12 = lex_oparen;
      goto switchD_001cd2e4_caseD_7e;
    case 0x29:
      LVar12 = lex_cparen;
      goto LAB_001cd957;
    case 0x2a:
      if (pbVar14[1] == 0x3d) {
        uVar13 = 2;
        LVar12 = lex_mulset;
        goto switchD_001cd2e4_caseD_7e;
      }
      if (pbVar14[1] != 0x2a) {
        LVar12 = lex_mul;
        goto LAB_001cd957;
      }
      bVar15 = pbVar14[2] == 0x3d;
      uVar5 = (uint)bVar15;
      LVar12 = lex_pow;
      LVar4 = lex_powset;
      break;
    case 0x2b:
      uVar13 = 2;
      if (pbVar14[1] == 0x3d) {
        LVar12 = lex_addset;
        goto switchD_001cd2e4_caseD_7e;
      }
      if (pbVar14[1] == 0x2b) {
        LVar12 = lex_inc;
        goto switchD_001cd2e4_caseD_7e;
      }
      LVar12 = lex_add;
      goto LAB_001cd957;
    case 0x2c:
      LVar12 = lex_comma;
      goto switchD_001cd2e4_caseD_7e;
    case 0x2d:
      uVar13 = 2;
      if (pbVar14[1] == 0x3d) {
        LVar12 = lex_subset;
        goto switchD_001cd2e4_caseD_7e;
      }
      if (pbVar14[1] == 0x2d) {
        LVar12 = lex_dec;
        goto switchD_001cd2e4_caseD_7e;
      }
      LVar12 = lex_sub;
      goto LAB_001cd957;
    case 0x2e:
      LVar12 = lex_point;
      goto switchD_001cd2e4_caseD_7e;
    case 0x2f:
      bVar11 = pbVar14[1];
      if (bVar11 == 0x2f) goto LAB_001cd2b3;
      if (bVar11 != 0x2a) {
        if (bVar11 == 0x3d) {
          uVar13 = 2;
          LVar12 = lex_divset;
          goto switchD_001cd2e4_caseD_7e;
        }
        LVar12 = lex_div;
        goto LAB_001cd957;
      }
      bVar11 = pbVar14[2];
      pbVar14 = pbVar14 + 2;
      if (bVar11 == 0) goto LAB_001cd251;
      uVar6 = this->line;
      iVar9 = 1;
      goto LAB_001cd6d7;
    case 0x3a:
      LVar12 = lex_colon;
      goto LAB_001cd957;
    case 0x3b:
      LVar12 = lex_semicolon;
      goto LAB_001cd957;
    case 0x3c:
      if (pbVar14[1] == 0x3d) {
        uVar13 = 2;
        LVar12 = lex_lequal;
        goto switchD_001cd2e4_caseD_7e;
      }
      if (pbVar14[1] != 0x3c) {
        LVar12 = lex_less;
        goto LAB_001cd957;
      }
      bVar15 = pbVar14[2] == 0x3d;
      uVar5 = (uint)bVar15;
      LVar12 = lex_shl;
      LVar4 = lex_shlset;
      break;
    case 0x3d:
      uVar5 = (uint)(pbVar14[1] == 0x3d);
      LVar12 = (uint)(pbVar14[1] != 0x3d) * 9 + lex_equal;
      goto LAB_001cd4df;
    case 0x3e:
      if (pbVar14[1] == 0x3d) {
        uVar13 = 2;
        LVar12 = lex_gequal;
        goto switchD_001cd2e4_caseD_7e;
      }
      if (pbVar14[1] != 0x3e) {
        LVar12 = lex_greater;
        goto LAB_001cd957;
      }
      bVar15 = pbVar14[2] == 0x3d;
      uVar5 = (uint)bVar15;
      LVar12 = lex_shr;
      LVar4 = lex_shrset;
      break;
    case 0x3f:
      LVar12 = lex_questionmark;
      goto LAB_001cd957;
    case 0x40:
      LVar12 = lex_at;
      goto switchD_001cd2e4_caseD_7e;
    default:
      if (bVar11 != 0) goto switchD_001cd279_caseD_b;
      uVar5 = this->line;
      uVar1 = (this->lexems).count;
      if (uVar1 == (this->lexems).max) {
        SmallArray<Lexeme,_32U>::grow(&this->lexems,uVar1);
      }
      pLVar2 = (this->lexems).data;
      if (pLVar2 != (Lexeme *)0x0) {
        uVar1 = (this->lexems).count;
        (this->lexems).count = uVar1 + 1;
        pLVar2[uVar1].type = lex_none;
        pLVar2[uVar1].pos = (char *)pbVar14;
        pLVar2[uVar1].length = 1;
        pLVar2[uVar1].line = uVar5;
        pLVar2[uVar1].column = uVar6 - (int)code;
        return;
      }
      goto LAB_001cdecd;
    }
    if (bVar15) {
      LVar12 = LVar4;
    }
    uVar13 = (ulong)(uVar5 | 2);
    goto switchD_001cd2e4_caseD_7e;
  }
  if (bVar11 < 0x7b) {
    if (bVar11 == 0x5b) {
      LVar12 = lex_obracket;
    }
    else {
      if (bVar11 != 0x5d) {
        if (bVar11 != 0x5e) goto switchD_001cd279_caseD_b;
        uVar13 = 2;
        if (pbVar14[1] == 0x5e) {
          LVar12 = lex_logxor;
        }
        else {
          if (pbVar14[1] != 0x3d) {
            LVar12 = lex_bitxor;
            goto LAB_001cd957;
          }
          LVar12 = lex_xorset;
        }
        goto switchD_001cd2e4_caseD_7e;
      }
      LVar12 = lex_cbracket;
    }
    goto LAB_001cd957;
  }
  LVar12 = lex_bitnot;
  switch(bVar11) {
  case 0x7b:
    LVar12 = lex_ofigure;
    goto LAB_001cd957;
  case 0x7c:
    uVar13 = 2;
    if (pbVar14[1] == 0x7c) {
      LVar12 = lex_logor;
    }
    else {
      if (pbVar14[1] != 0x3d) {
        LVar12 = lex_bitor;
        goto LAB_001cd957;
      }
      LVar12 = lex_orset;
    }
    break;
  case 0x7d:
    LVar12 = lex_cfigure;
LAB_001cd957:
    uVar13 = 1;
    break;
  case 0x7e:
    break;
  default:
switchD_001cd279_caseD_b:
    if ((byte)(bVar11 - 0x30) < 10) {
      if ((bVar11 == 0x30) && (pbVar14[1] == 0x78)) {
        for (pbVar10 = pbVar14 + 2;
            ((byte)(*pbVar10 - 0x30) < 10 || ((byte)((*pbVar10 & 0xdf) + 0xbf) < 6));
            pbVar10 = pbVar10 + 1) {
        }
      }
      else {
        pbVar10 = pbVar14 + -1;
        do {
          pbVar7 = pbVar10 + 1;
          pbVar10 = pbVar10 + 1;
        } while ((byte)(*pbVar7 - 0x30) < 10);
      }
      pbVar10 = pbVar10 + (*pbVar10 == 0x2e);
      do {
        pbVar7 = pbVar10;
        pbVar10 = pbVar7 + 1;
      } while ((byte)(*pbVar7 - 0x30) < 10);
      pbVar8 = pbVar7;
      if ((*pbVar7 == 0x65) && (pbVar8 = pbVar10, *pbVar10 == 0x2d)) {
        pbVar8 = pbVar7 + 2;
      }
      uVar13 = (ulong)(~uVar6 + (int)pbVar8);
      do {
        bVar11 = *pbVar8;
        pbVar8 = pbVar8 + 1;
        uVar13 = (ulong)((int)uVar13 + 1);
        LVar12 = lex_number;
      } while ((byte)(bVar11 - 0x30) < 10);
    }
    else {
      LVar12 = lex_none;
      if ((char)""[bVar11] < '\0') {
        uVar3 = 0;
        do {
          uVar13 = uVar3;
          uVar3 = uVar13 + 1;
        } while ((""[pbVar14[uVar13]] & 0x40) != 0);
        switch((int)uVar13) {
        case 2:
          if (*(short *)pbVar14 == 0x6669) {
            LVar12 = lex_if;
          }
          else {
            if (*(short *)pbVar14 != 0x6e69) {
              bVar15 = *(short *)pbVar14 == 0x6f64;
              LVar4 = lex_do;
              goto LAB_001cdd37;
            }
            LVar12 = lex_in;
          }
          break;
        case 3:
          if (pbVar14[2] == 0x72 && *(short *)pbVar14 == 0x6f66) {
            LVar12 = lex_for;
          }
          else {
            if (pbVar14[2] != 0x66 || *(short *)pbVar14 != 0x6572) {
              bVar15 = pbVar14[2] == 0x77 && *(short *)pbVar14 == 0x656e;
              LVar4 = lex_new;
              goto LAB_001cdd37;
            }
            LVar12 = lex_ref;
          }
          break;
        case 4:
          if (*(int *)pbVar14 == 0x65736163) {
            LVar12 = lex_case;
          }
          else if (*(int *)pbVar14 == 0x65736c65) {
            LVar12 = lex_else;
          }
          else if (*(int *)pbVar14 == 0x6f747561) {
            LVar12 = lex_auto;
          }
          else if (*(int *)pbVar14 == 0x65757274) {
            LVar12 = lex_true;
          }
          else {
            if (*(int *)pbVar14 != 0x6d756e65) {
              bVar15 = *(int *)pbVar14 == 0x68746977;
              LVar4 = lex_with;
              goto LAB_001cdd37;
            }
            LVar12 = lex_enum;
          }
          break;
        case 5:
          if (pbVar14[4] == 0x65 && *(int *)pbVar14 == 0x6c696877) {
            LVar12 = lex_while;
          }
          else if (pbVar14[4] == 0x6b && *(int *)pbVar14 == 0x61657262) {
            LVar12 = lex_break;
          }
          else if (pbVar14[4] == 0x73 && *(int *)pbVar14 == 0x73616c63) {
            LVar12 = lex_class;
          }
          else if (pbVar14[4] == 0x6e && *(int *)pbVar14 == 0x67696c61) {
            LVar12 = lex_align;
          }
          else if (pbVar14[4] == 100 && *(int *)pbVar14 == 0x6c656979) {
            LVar12 = lex_yield;
          }
          else {
            if (pbVar14[4] != 0x74 || *(int *)pbVar14 != 0x736e6f63) {
              bVar15 = pbVar14[4] == 0x65 && *(int *)pbVar14 == 0x736c6166;
              LVar4 = lex_false;
              goto LAB_001cdd37;
            }
            LVar12 = lex_const;
          }
          break;
        case 6:
          if (*(short *)(pbVar14 + 4) == 0x6863 && *(int *)pbVar14 == 0x74697773) {
            LVar12 = lex_switch;
          }
          else if (*(short *)(pbVar14 + 4) == 0x6e72 && *(int *)pbVar14 == 0x75746572) {
            LVar12 = lex_return;
          }
          else if (*(short *)(pbVar14 + 4) == 0x666f && *(int *)pbVar14 == 0x65707974) {
            LVar12 = lex_typeof;
          }
          else {
            if (*(short *)(pbVar14 + 4) != 0x666f || *(int *)pbVar14 != 0x657a6973) {
              bVar15 = *(short *)(pbVar14 + 4) == 0x7472 && *(int *)pbVar14 == 0x6f706d69;
              LVar4 = lex_import;
              goto LAB_001cdd37;
            }
            LVar12 = lex_sizeof;
          }
          break;
        case 7:
          if (*(int *)(pbVar14 + 3) == 0x6e67696c && *(int *)pbVar14 == 0x6c616f6e) {
            LVar12 = lex_noalign;
          }
          else if (*(int *)(pbVar14 + 3) == 0x746c7561 && *(int *)pbVar14 == 0x61666564) {
            LVar12 = lex_default;
          }
          else if (*(int *)(pbVar14 + 3) == 0x66656465 && *(int *)pbVar14 == 0x65707974) {
            LVar12 = lex_typedef;
          }
          else {
            if (*(int *)(pbVar14 + 3) != 0x7274706c || *(int *)pbVar14 != 0x6c6c756e) {
              bVar15 = *(int *)(pbVar14 + 3) == 0x63697265 && *(int *)pbVar14 == 0x656e6567;
              LVar4 = lex_generic;
              goto LAB_001cdd37;
            }
            LVar12 = lex_nullptr;
          }
          break;
        case 8:
          if (*(long *)pbVar14 != 0x65756e69746e6f63) {
            bVar15 = *(long *)pbVar14 == 0x726f74617265706f;
            LVar4 = lex_operator;
            goto LAB_001cdd37;
          }
          LVar12 = lex_continue;
          break;
        case 9:
          if (pbVar14[8] != 0x65 || *(long *)pbVar14 != 0x6e6974756f726f63) {
            bVar15 = pbVar14[8] == 0x65 && *(long *)pbVar14 == 0x63617073656d616e;
            LVar4 = lex_namespace;
            goto LAB_001cdd37;
          }
          LVar12 = lex_coroutine;
          break;
        case 10:
          bVar15 = *(short *)(pbVar14 + 8) == 0x656c && *(long *)pbVar14 == 0x6261646e65747865;
          LVar4 = lex_extendable;
LAB_001cdd37:
          LVar12 = lex_string;
          if (bVar15) {
            LVar12 = LVar4;
          }
          break;
        default:
          LVar12 = lex_string;
        }
      }
    }
  }
  goto switchD_001cd2e4_caseD_7e;
LAB_001cd2b3:
  for (; (*pbVar14 != 0 && (*pbVar14 != 10)); pbVar14 = pbVar14 + 1) {
  }
  goto LAB_001cd257;
LAB_001cd6d7:
  do {
    if (bVar11 < 0x22) {
      if (bVar11 == 10) {
        code = (char *)(pbVar14 + 1);
        uVar6 = uVar6 + 1;
        this->line = uVar6;
        pbVar14 = (byte *)code;
      }
      else {
        if (bVar11 != 0xd) goto LAB_001cd7e4;
        code = (char *)(pbVar14 + 1);
        if (pbVar14[1] == 10) {
          code = (char *)(pbVar14 + 2);
        }
        uVar6 = uVar6 + 1;
        this->line = uVar6;
        pbVar14 = (byte *)code;
      }
    }
    else {
      if (bVar11 == 0x22) {
LAB_001cd76f:
        pbVar14 = pbVar14 + 1;
LAB_001cd772:
        do {
          bVar11 = *pbVar14;
          if (bVar11 < 0x22) {
            if (bVar11 == 0) goto LAB_001cd7c6;
          }
          else {
            if (bVar11 != 0x5c) {
              if (bVar11 == 0x22) {
LAB_001cd7c6:
                pbVar14 = pbVar14 + (bVar11 == 0x22);
                goto LAB_001cd7e7;
              }
              goto LAB_001cd76f;
            }
            if (pbVar14[1] != 0) {
              pbVar14 = pbVar14 + 2;
              goto LAB_001cd772;
            }
          }
          if (bVar11 == 10) {
            code = (char *)(pbVar14 + 1);
          }
          else {
            if (bVar11 != 0xd) goto LAB_001cd76f;
            code = (char *)(pbVar14 + 1);
            if (pbVar14[1] == 10) {
              code = (char *)(pbVar14 + 2);
            }
          }
          uVar6 = uVar6 + 1;
          this->line = uVar6;
          pbVar14 = (byte *)code;
        } while( true );
      }
      if (bVar11 == 0x2f) {
        if (pbVar14[1] != 0x2a) goto LAB_001cd7e4;
        pbVar14 = pbVar14 + 2;
        iVar9 = iVar9 + 1;
      }
      else if ((bVar11 == 0x2a) && (pbVar14[1] == 0x2f)) {
        iVar9 = iVar9 + -1;
        pbVar14 = pbVar14 + 2;
      }
      else {
LAB_001cd7e4:
        pbVar14 = pbVar14 + 1;
      }
    }
LAB_001cd7e7:
    bVar11 = *pbVar14;
  } while ((bVar11 != 0) && (iVar9 != 0));
  goto LAB_001cd251;
LAB_001cd575:
  bVar11 = *pbVar10;
  if (0x26 < bVar11) {
    if (bVar11 == 0x5c) {
      if (pbVar10[1] == 0) goto LAB_001cd595;
      pbVar10 = pbVar10 + 2;
    }
    else {
      if (bVar11 == 0x27) goto LAB_001cd5cf;
LAB_001cd5ba:
      pbVar10 = pbVar10 + 1;
    }
    goto LAB_001cd575;
  }
  if (bVar11 != 0) {
LAB_001cd595:
    if (bVar11 == 10) {
      code = (char *)(pbVar10 + 1);
    }
    else {
      if (bVar11 != 0xd) goto LAB_001cd5ba;
      code = (char *)(pbVar10 + 1);
      if (pbVar10[1] == 10) {
        code = (char *)(pbVar10 + 2);
      }
    }
    uVar5 = uVar5 + 1;
    this->line = uVar5;
    pbVar10 = (byte *)code;
    goto LAB_001cd575;
  }
LAB_001cd5cf:
  uVar13 = (ulong)((((int)pbVar10 + 1) - (uint)(bVar11 == 0)) - uVar6);
  LVar12 = lex_semiquotedchar;
  goto switchD_001cd2e4_caseD_7e;
LAB_001cd4f1:
  bVar11 = *pbVar10;
  if (0x21 < bVar11) {
    if (bVar11 == 0x5c) {
      if (pbVar10[1] == 0) goto LAB_001cd511;
      pbVar10 = pbVar10 + 2;
    }
    else {
      if (bVar11 == 0x22) goto LAB_001cd54b;
LAB_001cd536:
      pbVar10 = pbVar10 + 1;
    }
    goto LAB_001cd4f1;
  }
  if (bVar11 != 0) {
LAB_001cd511:
    if (bVar11 == 10) {
      code = (char *)(pbVar10 + 1);
    }
    else {
      if (bVar11 != 0xd) goto LAB_001cd536;
      code = (char *)(pbVar10 + 1);
      if (pbVar10[1] == 10) {
        code = (char *)(pbVar10 + 2);
      }
    }
    uVar5 = uVar5 + 1;
    this->line = uVar5;
    pbVar10 = (byte *)code;
    goto LAB_001cd4f1;
  }
LAB_001cd54b:
  uVar13 = (ulong)((((int)pbVar10 + 1) - (uint)(bVar11 == 0)) - uVar6);
  LVar12 = lex_quotedstring;
switchD_001cd2e4_caseD_7e:
  uVar5 = this->line;
  uVar1 = (this->lexems).count;
  if (uVar1 == (this->lexems).max) {
    SmallArray<Lexeme,_32U>::grow(&this->lexems,uVar1);
  }
  pLVar2 = (this->lexems).data;
  if (pLVar2 == (Lexeme *)0x0) {
LAB_001cdecd:
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,"void SmallArray<Lexeme, 32>::push_back(const T &) [T = Lexeme, N = 32]");
  }
  uVar1 = (this->lexems).count;
  (this->lexems).count = uVar1 + 1;
  pLVar2[uVar1].type = LVar12;
  pLVar2[uVar1].pos = (char *)pbVar14;
  pLVar2[uVar1].length = (uint)uVar13;
  pLVar2[uVar1].line = uVar5;
  pLVar2[uVar1].column = uVar6 - (int)code;
  pbVar14 = pbVar14 + (int)(uint)uVar13;
  goto LAB_001cd251;
}

Assistant:

void Lexer::Lexify(const char* code)
{
	lexems.reserve(2048);

	const char *lineStart = code;
	line = 0;

	LexemeType lType = lex_none;
	int lLength = 1;

	while(*code)
	{
		switch(*code)
		{
		case '\r':
			code++;

			if(*code == '\n')
				code++;

			lineStart = code;
			line++;

			continue;
		case '\n':
			code++;

			lineStart = code;
			line++;

			continue;
		case ' ':
		case '\t':
			code++;
			while((unsigned char)(code[0] - 1) < ' ' && *code != '\r' && *code != '\n')
				code++;
			continue;
		case '\"':
			lType = lex_quotedstring;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\"')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '\'':
			lType = lex_semiquotedchar;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\'')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '.':
			lType = lex_point;
			break;
		case ',':
			lType = lex_comma;
			break;
		case '+':
			lType = lex_add;
			if(code[1] == '=')
			{
				lType = lex_addset;
				lLength = 2;
			}else if(code[1] == '+'){
				lType = lex_inc;
				lLength = 2;
			}
			break;
		case '-':
			lType = lex_sub;
			if(code[1] == '=')
			{
				lType = lex_subset;
				lLength = 2;
			}else if(code[1] == '-'){
				lType = lex_dec;
				lLength = 2;
			}
			break;
		case '*':
			lType = lex_mul;
			if(code[1] == '=')
			{
				lType = lex_mulset;
				lLength = 2;
			}else if(code[1] == '*'){
				lType = lex_pow;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_powset;
					lLength = 3;
				}
			}
			break;
		case '/':
			if(code[1] == '=')
			{
				lType = lex_divset;
				lLength = 2;
			}else if(code[1] == '/'){
				while(code[0] != '\n' && code[0] != '\0')
					code++;
				continue;
			}else if(code[1] == '*'){
				code += 2;
				unsigned depth = 1;
				while(*code && depth)
				{
					if(code[0] == '*' && code[1] == '/')
					{
						code += 2;
						depth--;
					}
					else if(code[0] == '/' && code[1] == '*')
					{
						code += 2;
						depth++;
					}
					else if(code[0] == '\"')
					{
						code++;

						while(code[0] && code[0] != '\"')
						{
							if(code[0] == '\\' && code[1])
							{
								code += 2;
							}
							else if(code[0] == '\r')
							{
								code++;

								if(*code == '\n')
									code++;

								lineStart = code;
								line++;
							}
							else if(code[0] == '\n')
							{
								code++;

								lineStart = code;
								line++;
							}
							else
							{
								code += 1;
							}
						}

						if(code[0] == '\"')
							code++;
					}
					else if(code[0] == '\r')
					{
						code++;

						if(*code == '\n')
							code++;

						lineStart = code;
						line++;
					}
					else if(code[0] == '\n')
					{
						code++;

						lineStart = code;
						line++;
					}
					else
					{
						code++;
					}
				}
				continue;
			}else{
				lType = lex_div;
			}
			break;
		case '%':
			lType = lex_mod;
			if(code[1] == '=')
			{
				lType = lex_modset;
				lLength = 2;
			}
			break;
		case '<':
			lType = lex_less;
			if(code[1] == '=')
			{
				lType = lex_lequal;
				lLength = 2;
			}else if(code[1] == '<'){
				lType = lex_shl;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shlset;
					lLength = 3;
				}
			}
			break;
		case '>':
			lType = lex_greater;
			if(code[1] == '=')
			{
				lType = lex_gequal;
				lLength = 2;
			}else if(code[1] == '>'){
				lType = lex_shr;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shrset;
					lLength = 3;
				}
			}
			break;
		case '=':
			lType = lex_set;
			if(code[1] == '=')
			{
				lType = lex_equal;
				lLength = 2;
			}
			break;
		case '!':
			lType = lex_lognot;
			if(code[1] == '=')
			{
				lType = lex_nequal;
				lLength = 2;
			}
			break;
		case '@':
			lType = lex_at;
			break;
		case '~':
			lType = lex_bitnot;
			break;
		case '&':
			lType = lex_bitand;
			if(code[1] == '&')
			{
				lType = lex_logand;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_andset;
				lLength = 2;
			}
			break;
		case '|':
			lType = lex_bitor;
			if(code[1] == '|')
			{
				lType = lex_logor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_orset;
				lLength = 2;
			}
			break;
		case '^':
			lType = lex_bitxor;
			if(code[1] == '^')
			{
				lType = lex_logxor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_xorset;
				lLength = 2;
			}
			break;
		case '(':
			lType = lex_oparen;
			break;
		case ')':
			lType = lex_cparen;
			break;
		case '[':
			lType = lex_obracket;
			break;
		case ']':
			lType = lex_cbracket;
			break;
		case '{':
			lType = lex_ofigure;
			break;
		case '}':
			lType = lex_cfigure;
			break;
		case '?':
			lType = lex_questionmark;
			break;
		case ':':
			lType = lex_colon;
			break;
		case ';':
			lType = lex_semicolon;
			break;
		default:
			if(isDigit(*code))
			{
				lType = lex_number;

				const char *pos = code;
				if(pos[0] == '0' && pos[1] == 'x')
				{
					pos += 2;
					while(isDigit(*pos) || ((*pos & ~0x20) >= 'A' && (*pos & ~0x20) <= 'F'))
						pos++;
				}else{
					while(isDigit(*pos))
						pos++;
				}
				if(*pos == '.')
					pos++;
				while(isDigit(*pos))
					pos++;
				if(*pos == 'e')
				{
					pos++;
					if(*pos == '-')
						pos++;
				}
				while(isDigit(*pos))
					pos++;
				lLength = (int)(pos - code);
			}else if(chartype_table[(unsigned char)*code] & ct_start_symbol){
				const char *pos = code;
				while(chartype_table[(unsigned char)*pos] & ct_symbol)
					pos++;
				lLength = (int)(pos - code);

				if(!(chartype_table[(unsigned char)*pos] & ct_symbol))
				{
					switch(lLength)
					{
					case 2:
						if(memcmp(code, "if", 2) == 0)
							lType = lex_if;
						else if(memcmp(code, "in", 2) == 0)
							lType = lex_in;
						else if(memcmp(code, "do", 2) == 0)
							lType = lex_do;
						break;
					case 3:
						if(memcmp(code, "for", 3) == 0)
							lType = lex_for;
						else if(memcmp(code, "ref", 3) == 0)
							lType = lex_ref;
						else if(memcmp(code, "new", 3) == 0)
							lType = lex_new;
						break;
					case 4:
						if(memcmp(code, "case", 4) == 0)
							lType = lex_case;
						else if(memcmp(code, "else", 4) == 0)
							lType = lex_else;
						else if(memcmp(code, "auto", 4) == 0)
							lType = lex_auto;
						else if(memcmp(code, "true", 4) == 0)
							lType = lex_true;
						else if(memcmp(code, "enum", 4) == 0)
							lType = lex_enum;
						else if(memcmp(code, "with", 4) == 0)
							lType = lex_with;
						break;
					case 5:
						if(memcmp(code, "while", 5) == 0)
							lType = lex_while;
						else if(memcmp(code, "break", 5) == 0)
							lType = lex_break;
						else if(memcmp(code, "class", 5) == 0)
							lType = lex_class;
						else if(memcmp(code, "align", 5) == 0)
							lType = lex_align;
						else if(memcmp(code, "yield", 5) == 0)
							lType = lex_yield;
						else if(memcmp(code, "const", 5) == 0)
							lType = lex_const;
						else if(memcmp(code, "false", 5) == 0)
							lType = lex_false;
						break;
					case 6:
						if(memcmp(code, "switch", 6) == 0)
							lType = lex_switch;
						else if(memcmp(code, "return", 6) == 0)
							lType = lex_return;
						else if(memcmp(code, "typeof", 6) == 0)
							lType = lex_typeof;
						else if(memcmp(code, "sizeof", 6) == 0)
							lType = lex_sizeof;
						else if(memcmp(code, "import", 6) == 0)
							lType = lex_import;
						break;
					case 7:
						if(memcmp(code, "noalign", 7) == 0)
							lType = lex_noalign;
						else if(memcmp(code, "default", 7) == 0)
							lType = lex_default;
						else if(memcmp(code, "typedef", 7) == 0)
							lType = lex_typedef;
						else if(memcmp(code, "nullptr", 7) == 0)
							lType = lex_nullptr;
						else if(memcmp(code, "generic", 7) == 0)
							lType = lex_generic;
						break;
					case 8:
						if(memcmp(code, "continue", 8) == 0)
							lType = lex_continue;
						else if(memcmp(code, "operator", 8) == 0)
							lType = lex_operator;
						break;
					case 9:
						if(memcmp(code, "coroutine", 9) == 0)
							lType = lex_coroutine;
						else if(memcmp(code, "namespace", 9) == 0)
							lType = lex_namespace;
						break;
					case 10:
						if(memcmp(code, "extendable", 10) == 0)
							lType = lex_extendable;
						break;
					}
				}

				if(lType == lex_none)
					lType = lex_string;
			}
		}
		Lexeme lex;

		lex.type = lType;
		lex.length = lLength;

		lex.pos = code;

		lex.line = line;
		lex.column = unsigned(code - lineStart);

		lexems.push_back(lex);

		code += lLength;
		lType = lex_none;
		lLength = 1;
	}

	Lexeme lex;

	lex.type = lex_none;
	lex.length = 1;

	lex.pos = code;

	lex.line = line;
	lex.column = unsigned(code - lineStart);

	lexems.push_back(lex);
}